

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

void __thiscall glslang::TShader::TShader(TShader *this,EShLanguage s)

{
  EShLanguage EVar1;
  TPoolAllocator *pTVar2;
  TInfoSink *pTVar3;
  TCompiler *pTVar4;
  TIntermediate *this_00;
  
  this->_vptr_TShader = (_func_int **)&PTR__TShader_00af5d18;
  this->stage = s;
  this->lengths = (int *)0x0;
  this->stringNames = (char **)0x0;
  this->preamble = "";
  (this->sourceEntryPointName)._M_dataplus._M_p = (pointer)&(this->sourceEntryPointName).field_2;
  (this->sourceEntryPointName)._M_string_length = 0;
  (this->sourceEntryPointName).field_2._M_local_buf[0] = '\0';
  this->overrideVersion = 0;
  this->compileOnly = false;
  pTVar2 = (TPoolAllocator *)operator_new(0x60);
  TPoolAllocator::TPoolAllocator(pTVar2,0x2000,0x10);
  this->pool = pTVar2;
  pTVar3 = (TInfoSink *)operator_new(0x60);
  (pTVar3->info).sink._M_dataplus._M_p = (pointer)&(pTVar3->info).sink.field_2;
  (pTVar3->info).sink._M_string_length = 0;
  (pTVar3->info).sink.field_2._M_local_buf[0] = '\0';
  (pTVar3->info).outputStream = 4;
  (pTVar3->info).shaderFileName = (char *)0x0;
  (pTVar3->debug).sink._M_dataplus._M_p = (pointer)&(pTVar3->debug).sink.field_2;
  (pTVar3->debug).sink._M_string_length = 0;
  (pTVar3->debug).sink.field_2._M_local_buf[0] = '\0';
  (pTVar3->debug).outputStream = 4;
  (pTVar3->debug).shaderFileName = (char *)0x0;
  this->infoSink = pTVar3;
  pTVar4 = (TCompiler *)operator_new(0x20);
  EVar1 = this->stage;
  pTVar2 = (TPoolAllocator *)operator_new(0x60);
  TPoolAllocator::TPoolAllocator(pTVar2,0x2000,0x10);
  (pTVar4->super_TShHandleBase).pool = pTVar2;
  pTVar4->infoSink = pTVar3;
  pTVar4->language = EVar1;
  pTVar4->haveValidObjectCode = false;
  (pTVar4->super_TShHandleBase)._vptr_TShHandleBase = (_func_int **)&PTR__TShHandleBase_00af5dd8;
  this->compiler = pTVar4;
  this_00 = (TIntermediate *)operator_new(0x7e8);
  TIntermediate::TIntermediate(this_00,s,0,ENoProfile);
  this->intermediate = this_00;
  (this->environment).input.languageFamily = EShSourceNone;
  (this->environment).input.dialect = EShClientNone;
  (this->environment).input.vulkanRulesRelaxed = false;
  (this->environment).client.client = EShClientNone;
  (this->environment).target.language = EShTargetNone;
  (this->environment).target.hlslFunctionality1 = false;
  return;
}

Assistant:

TShader::TShader(EShLanguage s)
    : stage(s), lengths(nullptr), stringNames(nullptr), preamble(""), overrideVersion(0)
{
    pool = new TPoolAllocator;
    infoSink = new TInfoSink;
    compiler = new TDeferredCompiler(stage, *infoSink);
    intermediate = new TIntermediate(s);

    // clear environment (avoid constructors in them for use in a C interface)
    environment.input.languageFamily = EShSourceNone;
    environment.input.dialect = EShClientNone;
    environment.input.vulkanRulesRelaxed = false;
    environment.client.client = EShClientNone;
    environment.target.language = EShTargetNone;
    environment.target.hlslFunctionality1 = false;
}